

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUtil.cpp
# Opt level: O2

Move<vk::Handle<(vk::HandleType)17>_> *
vkt::tessellation::makeRenderPassWithoutAttachments
          (Move<vk::Handle<(vk::HandleType)17>_> *__return_storage_ptr__,DeviceInterface *vk,
          VkDevice device)

{
  VkAttachmentReference unusedAttachment;
  VkRenderPassCreateInfo renderPassInfo;
  VkAttachmentReference local_a0;
  VkRenderPassCreateInfo local_98;
  VkSubpassDescription local_58;
  
  local_58.pDepthStencilAttachment = &local_a0;
  local_a0.attachment = 0xffffffff;
  local_a0.layout = VK_IMAGE_LAYOUT_UNDEFINED;
  local_98.pSubpasses = &local_58;
  local_58.preserveAttachmentCount = 0;
  local_58._60_4_ = 0;
  local_58.pColorAttachments = (VkAttachmentReference *)0x0;
  local_58.pResolveAttachments = (VkAttachmentReference *)0x0;
  local_58.pInputAttachments = (VkAttachmentReference *)0x0;
  local_58.colorAttachmentCount = 0;
  local_58._28_4_ = 0;
  local_58.flags = 0;
  local_58.pipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;
  local_58.inputAttachmentCount = 0;
  local_58._12_4_ = 0;
  local_58.pPreserveAttachments = (deUint32 *)0x0;
  local_98.pNext = (void *)0x0;
  local_98.dependencyCount = 0;
  local_98._52_4_ = 0;
  local_98.pDependencies = (VkSubpassDependency *)0x0;
  local_98.flags = 0;
  local_98.attachmentCount = 0;
  local_98.pAttachments = (VkAttachmentDescription *)0x0;
  local_98.sType = VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO;
  local_98._4_4_ = 0;
  local_98.subpassCount = 1;
  local_98._36_4_ = 0;
  ::vk::createRenderPass(__return_storage_ptr__,vk,device,&local_98,(VkAllocationCallbacks *)0x0);
  return __return_storage_ptr__;
}

Assistant:

Move<VkRenderPass> makeRenderPassWithoutAttachments (const DeviceInterface&	vk,
													 const VkDevice			device)
{
	const VkAttachmentReference unusedAttachment =
	{
		VK_ATTACHMENT_UNUSED,								// deUint32			attachment;
		VK_IMAGE_LAYOUT_UNDEFINED							// VkImageLayout	layout;
	};

	const VkSubpassDescription subpassDescription =
	{
		(VkSubpassDescriptionFlags)0,						// VkSubpassDescriptionFlags		flags;
		VK_PIPELINE_BIND_POINT_GRAPHICS,					// VkPipelineBindPoint				pipelineBindPoint;
		0u,													// deUint32							inputAttachmentCount;
		DE_NULL,											// const VkAttachmentReference*		pInputAttachments;
		0u,													// deUint32							colorAttachmentCount;
		DE_NULL,											// const VkAttachmentReference*		pColorAttachments;
		DE_NULL,											// const VkAttachmentReference*		pResolveAttachments;
		&unusedAttachment,									// const VkAttachmentReference*		pDepthStencilAttachment;
		0u,													// deUint32							preserveAttachmentCount;
		DE_NULL												// const deUint32*					pPreserveAttachments;
	};

	const VkRenderPassCreateInfo renderPassInfo =
	{
		VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO,			// VkStructureType					sType;
		DE_NULL,											// const void*						pNext;
		(VkRenderPassCreateFlags)0,							// VkRenderPassCreateFlags			flags;
		0u,													// deUint32							attachmentCount;
		DE_NULL,											// const VkAttachmentDescription*	pAttachments;
		1u,													// deUint32							subpassCount;
		&subpassDescription,								// const VkSubpassDescription*		pSubpasses;
		0u,													// deUint32							dependencyCount;
		DE_NULL												// const VkSubpassDependency*		pDependencies;
	};

	return createRenderPass(vk, device, &renderPassInfo);
}